

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::EagerPromiseNode<unsigned_int>::destroy(EagerPromiseNode<unsigned_int> *this)

{
  EagerPromiseNode<unsigned_int> *this_local;
  
  freePromise<kj::_::EagerPromiseNode<unsigned_int>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }